

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O1

Value * __thiscall
camp::Property::get(Value *__return_storage_ptr__,Property *this,UserObject *object)

{
  element_type *peVar1;
  char cVar2;
  int iVar3;
  ForbiddenRead *__return_storage_ptr___00;
  string local_b0;
  string local_90;
  ForbiddenRead local_70;
  
  iVar3 = (*(this->super_TagHolder)._vptr_TagHolder[5])(this);
  if ((char)iVar3 != '\0') {
    peVar1 = (this->m_readable).m_getter.
             super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      cVar2 = (this->m_readable).m_defaultValue;
    }
    else {
      cVar2 = (**(code **)(*(long *)peVar1 + 0x10))(peVar1,object);
    }
    if (cVar2 != '\0') {
      (*(this->super_TagHolder)._vptr_TagHolder[3])(__return_storage_ptr__,this,object);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr___00 = (ForbiddenRead *)__cxa_allocate_exception(0x48);
  ForbiddenRead::ForbiddenRead(&local_70,&this->m_name);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/property.cpp"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Value camp::Property::get(const UserObject &) const","");
  Error::prepare<camp::ForbiddenRead>(__return_storage_ptr___00,&local_70,&local_90,0x49,&local_b0);
  __cxa_throw(__return_storage_ptr___00,&ForbiddenRead::typeinfo,Error::~Error);
}

Assistant:

Value Property::get(const UserObject& object) const
{
    // Check if the property is readable
    if (!readable(object))
        CAMP_ERROR(ForbiddenRead(name()));

    return getValue(object);
}